

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O2

int Cba_CommandPut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Cba_Man_t *p;
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  uint fSeq;
  uint fBarBufs;
  char *pcVar3;
  
  p = (Cba_Man_t *)pAbc->pAbcCba;
  fSeq = 0;
  Extra_UtilGetoptReset();
  fBarBufs = 1;
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"bsvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x73) {
      fSeq = fSeq ^ 1;
    }
    else {
      if (iVar1 != 0x62) {
        Abc_Print(-2,"usage: :put [-bsvh]\n");
        Abc_Print(-2,"\t         extracts AIG from the hierarchical design\n");
        pcVar3 = "yes";
        pcVar2 = "yes";
        if (fBarBufs == 0) {
          pcVar2 = "no";
        }
        Abc_Print(-2,"\t-b     : toggle using barrier buffers [default = %s]\n",pcVar2);
        pcVar2 = "yes";
        if (fSeq == 0) {
          pcVar2 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle blasting sequential elements [default = %s]\n",pcVar2);
        if (fVerbose == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      fBarBufs = fBarBufs ^ 1;
    }
  }
  if (p == (Cba_Man_t *)0x0) {
    pcVar2 = "Cba_CommandPut(): There is no current design.\n";
  }
  else {
    pNew = Cba_ManBlast(p,fBarBufs,fSeq,fVerbose);
    if (pNew != (Gia_Man_t *)0x0) {
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    pcVar2 = "Cba_CommandPut(): Conversion to AIG has failed.\n";
  }
  Abc_Print(1,pcVar2);
  return 0;
}

Assistant:

int Cba_CommandPut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    Gia_Man_t * pGia = NULL;
    int c, fBarBufs = 1, fSeq = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBarBufs ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandPut(): There is no current design.\n" );
        return 0;
    }
    pGia = Cba_ManBlast( p, fBarBufs, fSeq, fVerbose );
    if ( pGia == NULL )
    {
        Abc_Print( 1, "Cba_CommandPut(): Conversion to AIG has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;
usage:
    Abc_Print( -2, "usage: :put [-bsvh]\n" );
    Abc_Print( -2, "\t         extracts AIG from the hierarchical design\n" );
    Abc_Print( -2, "\t-b     : toggle using barrier buffers [default = %s]\n", fBarBufs? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle blasting sequential elements [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}